

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares.c
# Opt level: O2

uint64_t aom_var_2d_u16_c(uint8_t *src,int src_stride,int width,int height)

{
  ushort uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  lVar5 = (long)src * 2;
  iVar6 = 0;
  uVar7 = 0;
  if (0 < width) {
    uVar7 = (ulong)(uint)width;
  }
  iVar8 = 0;
  if (0 < height) {
    iVar8 = height;
  }
  lVar4 = 0;
  lVar2 = 0;
  for (; iVar6 != iVar8; iVar6 = iVar6 + 1) {
    for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = *(ushort *)(lVar5 + uVar3 * 2);
      lVar2 = lVar2 + (ulong)uVar1;
      lVar4 = lVar4 + (ulong)((uint)uVar1 * (uint)uVar1);
    }
    lVar5 = lVar5 + (long)src_stride * 2;
  }
  return lVar4 - (ulong)(lVar2 * lVar2) / (ulong)(long)(height * width);
}

Assistant:

uint64_t aom_var_2d_u16_c(uint8_t *src, int src_stride, int width, int height) {
  uint16_t *srcp = CONVERT_TO_SHORTPTR(src);
  int r, c;
  uint64_t ss = 0, s = 0;

  for (r = 0; r < height; r++) {
    for (c = 0; c < width; c++) {
      const uint16_t v = srcp[c];
      ss += v * v;
      s += v;
    }
    srcp += src_stride;
  }

  return (ss - s * s / (width * height));
}